

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

void __thiscall QTextStreamPrivate::ungetChar(QTextStreamPrivate *this,QChar ch)

{
  long lVar1;
  Data *pDVar2;
  QString *this_00;
  
  this_00 = this->string;
  if (this_00 == (QString *)0x0) {
    lVar1 = this->readBufferOffset;
    this_00 = &this->readBuffer;
    if (lVar1 == 0) goto LAB_00304f72;
    this->readBufferOffset = lVar1 + -1;
    pDVar2 = (this->readBuffer).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(this_00,(this->readBuffer).d.size,KeepSize);
    }
    (this->readBuffer).d.ptr[lVar1 + -1] = ch.ucs;
  }
  else {
    lVar1 = this->stringOffset;
    if (lVar1 == 0) {
LAB_00304f72:
      QString::insert(this_00,0,ch);
      return;
    }
    this->stringOffset = lVar1 + -1;
    pDVar2 = (this_00->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(this_00,(this_00->d).size,KeepSize);
    }
    (this_00->d).ptr[lVar1 + -1] = ch.ucs;
  }
  return;
}

Assistant:

inline void QTextStreamPrivate::ungetChar(QChar ch)
{
    if (string) {
        if (stringOffset == 0)
            string->prepend(ch);
        else
            (*string)[--stringOffset] = ch;
        return;
    }

    if (readBufferOffset == 0) {
        readBuffer.prepend(ch);
        return;
    }

    readBuffer[--readBufferOffset] = ch;
}